

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O0

ssize_t __thiscall
sc_core::wif_sc_bit_trace::write(wif_sc_bit_trace *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined8 uVar2;
  sc_bit *psVar3;
  undefined4 in_register_00000034;
  sc_bit *unaff_retaddr;
  
  bVar1 = sc_dt::operator==(unaff_retaddr,SUB81((ulong)this >> 0x38,0));
  if (bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \'1\' ;\n",uVar2);
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \'0\' ;\n",uVar2);
  }
  psVar3 = sc_dt::sc_bit::operator=(&this->old_value,this->object);
  return (ssize_t)psVar3;
}

Assistant:

void wif_sc_bit_trace::write(FILE* f)
{
    if (object == true) {
        std::fprintf(f, "assign %s \'1\' ;\n", wif_name.c_str());
    } else {
	std::fprintf(f, "assign %s \'0\' ;\n", wif_name.c_str());
    }
    old_value = object;
}